

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkMakeOnePo(Abc_Ntk_t *pNtkInit,int Output,int nRange)

{
  uint uVar1;
  uint uVar2;
  Abc_Obj_t *pObj;
  void *pvVar3;
  int iVar4;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  char *__s;
  int iVar10;
  
  if (pNtkInit->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNtkInit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                  ,0x675,"Abc_Ntk_t *Abc_NtkMakeOnePo(Abc_Ntk_t *, int, int)");
  }
  if (pNtkInit->nObjCounts[8] != pNtkInit->vBoxes->nSize) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtkInit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                  ,0x676,"Abc_Ntk_t *Abc_NtkMakeOnePo(Abc_Ntk_t *, int, int)");
  }
  if ((Output < 0) || (pNtkInit->vPos->nSize <= Output)) {
    puts("PO index is incorrect.");
    pNtk = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtk = Abc_NtkDup(pNtkInit);
    if (pNtk->vPos->nSize != 1) {
      pVVar5 = (Vec_Ptr_t *)malloc(0x10);
      uVar9 = 8;
      if (8 < nRange) {
        uVar9 = (ulong)(uint)nRange;
      }
      pVVar5->nSize = 0;
      pVVar5->nCap = (int)uVar9;
      ppvVar6 = (void **)malloc(uVar9 << 3);
      pVVar5->pArray = ppvVar6;
      pVVar7 = pNtk->vPos;
      if (0 < pVVar7->nSize) {
        iVar4 = 1;
        if (1 < nRange) {
          iVar4 = nRange;
        }
        uVar9 = 0;
        do {
          pObj = (Abc_Obj_t *)pVVar7->pArray[uVar9];
          if ((uVar9 < (uint)Output) || ((uint)(iVar4 + Output) <= uVar9)) {
            Abc_NtkDeleteObjPo(pObj);
          }
          else {
            uVar1 = pVVar5->nCap;
            if (pVVar5->nSize == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (pVVar5->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
                }
                iVar10 = 0x10;
              }
              else {
                iVar10 = uVar1 * 2;
                if (iVar10 <= (int)uVar1) goto LAB_001ef7ac;
                if (pVVar5->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
                }
              }
              pVVar5->pArray = ppvVar6;
              pVVar5->nCap = iVar10;
            }
LAB_001ef7ac:
            iVar10 = pVVar5->nSize;
            pVVar5->nSize = iVar10 + 1;
            pVVar5->pArray[iVar10] = pObj;
          }
          uVar9 = uVar9 + 1;
          pVVar7 = pNtk->vPos;
        } while ((long)uVar9 < (long)pVVar7->nSize);
      }
      pVVar7 = (Vec_Ptr_t *)malloc(0x10);
      iVar4 = pVVar5->nSize;
      pVVar7->nSize = iVar4;
      iVar10 = pVVar5->nCap;
      pVVar7->nCap = iVar10;
      if ((long)iVar10 == 0) {
        ppvVar6 = (void **)0x0;
      }
      else {
        ppvVar6 = (void **)malloc((long)iVar10 << 3);
      }
      pVVar7->pArray = ppvVar6;
      memcpy(ppvVar6,pVVar5->pArray,(long)iVar4 << 3);
      pVVar8 = pNtk->vCos;
      uVar1 = pNtk->vPos->nSize;
      uVar9 = (ulong)uVar1;
      if ((int)uVar1 < pVVar8->nSize) {
        do {
          if ((int)uVar1 < 0) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar3 = pVVar8->pArray[uVar9];
          uVar2 = pVVar7->nCap;
          if (pVVar7->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
              }
              iVar4 = 0x10;
            }
            else {
              iVar4 = uVar2 * 2;
              if (iVar4 <= (int)uVar2) goto LAB_001ef8ce;
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
              }
            }
            pVVar7->pArray = ppvVar6;
            pVVar7->nCap = iVar4;
          }
LAB_001ef8ce:
          iVar4 = pVVar7->nSize;
          pVVar7->nSize = iVar4 + 1;
          pVVar7->pArray[iVar4] = pvVar3;
          uVar9 = uVar9 + 1;
          pVVar8 = pNtk->vCos;
        } while ((int)uVar9 < pVVar8->nSize);
      }
      pVVar8 = pNtk->vPos;
      if (pVVar8->pArray != (void **)0x0) {
        free(pVVar8->pArray);
        pVVar8->pArray = (void **)0x0;
      }
      if (pVVar8 != (Vec_Ptr_t *)0x0) {
        free(pVVar8);
      }
      pNtk->vPos = pVVar5;
      pVVar5 = pNtk->vCos;
      if (pVVar5->pArray != (void **)0x0) {
        free(pVVar5->pArray);
        pVVar5->pArray = (void **)0x0;
      }
      if (pVVar5 != (Vec_Ptr_t *)0x0) {
        free(pVVar5);
      }
      pNtk->vCos = pVVar7;
      if (pNtk->ntkType == ABC_NTK_STRASH) {
        Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
        __s = "Run sequential cleanup (\"scl\") to get rid of dangling logic.";
      }
      else {
        __s = "Run sequential cleanup (\"st; scl\") to get rid of dangling logic.";
      }
      puts(__s);
      iVar4 = Abc_NtkCheck(pNtk);
      if (iVar4 == 0) {
        fwrite("Abc_NtkMakeComb(): Network check has failed.\n",0x2d,1,_stdout);
      }
    }
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkMakeOnePo( Abc_Ntk_t * pNtkInit, int Output, int nRange )
{
    Abc_Ntk_t * pNtk;
    Vec_Ptr_t * vPosLeft;
    Vec_Ptr_t * vCosLeft;
    Abc_Obj_t * pNodePo;
    int i;
    assert( !Abc_NtkIsNetlist(pNtkInit) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtkInit) );
    if ( Output < 0 || Output >= Abc_NtkPoNum(pNtkInit) )
    {
        printf( "PO index is incorrect.\n" );
        return NULL;
    }

    pNtk = Abc_NtkDup( pNtkInit );
    if ( Abc_NtkPoNum(pNtk) == 1 )
        return pNtk;

    if ( nRange < 1 )
        nRange = 1;

    // filter POs
    vPosLeft = Vec_PtrAlloc( nRange );
    Abc_NtkForEachPo( pNtk, pNodePo, i )
        if ( i < Output || i >= Output + nRange )
            Abc_NtkDeleteObjPo( pNodePo );
        else
            Vec_PtrPush( vPosLeft, pNodePo );
    // filter COs
    vCosLeft = Vec_PtrDup( vPosLeft );
    for ( i = Abc_NtkPoNum(pNtk); i < Abc_NtkCoNum(pNtk); i++ )
        Vec_PtrPush( vCosLeft, Abc_NtkCo(pNtk, i) );
    // update arrays
    Vec_PtrFree( pNtk->vPos );  pNtk->vPos = vPosLeft;
    Vec_PtrFree( pNtk->vCos );  pNtk->vCos = vCosLeft;

    // clean the network
    if ( Abc_NtkIsStrash(pNtk) )
    {
        Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
        printf( "Run sequential cleanup (\"scl\") to get rid of dangling logic.\n" );
    }
    else
    {
        printf( "Run sequential cleanup (\"st; scl\") to get rid of dangling logic.\n" );
    }

    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkMakeComb(): Network check has failed.\n" );
    return pNtk;
}